

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

void aura_transport_register(aura_transport *tr)

{
  aura_transport *tr_local;
  
  if (tr->name == (char *)0x0) {
    slog(0,3,"Transport %s missing required field aura_transport.%s; Disabled",tr->name,"name");
  }
  else if (tr->open == (_func_int_aura_node_ptr_char_ptr *)0x0) {
    slog(0,3,"Transport %s missing required field aura_transport.%s; Disabled",tr->name,"open");
  }
  else if (tr->close == (_func_void_aura_node_ptr *)0x0) {
    slog(0,3,"Transport %s missing required field aura_transport.%s; Disabled",tr->name,"close");
  }
  else if (tr->handle_event == (_func_void_aura_node_ptr_node_event_aura_pollfds_ptr *)0x0) {
    slog(0,3,"Transport %s missing required field aura_transport.%s; Disabled",tr->name,
         "handle_event");
  }
  else {
    if ((tr->buffer_get != (_func_aura_buffer_ptr_aura_buffer_ptr *)0x0) ||
       (tr->buffer_put != (_func_void_aura_buffer_ptr_aura_buffer_ptr *)0x0)) {
      if (tr->buffer_get == (_func_aura_buffer_ptr_aura_buffer_ptr *)0x0) {
        slog(0,3,"Transport %s missing required field aura_transport.%s; Disabled",tr->name,
             "buffer_get");
        return;
      }
      if (tr->buffer_put == (_func_void_aura_buffer_ptr_aura_buffer_ptr *)0x0) {
        slog(0,3,"Transport %s missing required field aura_transport.%s; Disabled",tr->name,
             "buffer_put");
        return;
      }
    }
    if (tr->buffer_overhead < tr->buffer_offset) {
      slog(0,3,"Transport has buffer_overhead (%d) < buffer_offset (%d). It will crash. Disabled",
           (ulong)(uint)tr->buffer_overhead,(ulong)(uint)tr->buffer_offset);
    }
    else {
      list_add_tail(&tr->registry,&transports);
    }
  }
  return;
}

Assistant:

void aura_transport_register(struct aura_transport *tr)
{
	/* Check if we have all that is required */
	required(name);
	required(open);
	required(close);
	required(handle_event);

	if ((tr->buffer_get) || (tr->buffer_put)) {
		required(buffer_get);
		required(buffer_put)
	}

	/* Warn against erroneous config */
	if (tr->buffer_overhead < tr->buffer_offset) {
		slog(0, SLOG_WARN,
		     "Transport has buffer_overhead (%d) < buffer_offset (%d). It will crash. Disabled",
		     tr->buffer_overhead, tr->buffer_offset);
		return;
	}

	/* Add it! */
	list_add_tail(&tr->registry, &transports);
}